

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersector1<4,_1,_false,_embree::avx2::ArrayIntersector1<embree::avx2::InstanceArrayIntersector1>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  undefined1 (*pauVar5) [16];
  undefined1 (*pauVar6) [16];
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  byte bVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar16;
  ulong uVar17;
  Primitive *prim;
  ulong uVar18;
  undefined4 uVar19;
  vint4 bi_1;
  undefined1 auVar21 [16];
  vint4 bi;
  undefined1 auVar22 [16];
  vint4 ai;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [64];
  undefined1 auVar30 [16];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  Precalculations pre;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  Precalculations local_1021;
  ulong local_1020;
  undefined1 local_1018 [16];
  ulong local_1008;
  RayHit *local_1000;
  RayQueryContext *local_ff8;
  long local_ff0;
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  ulong uVar15;
  undefined1 auVar20 [64];
  
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 != 8) {
    pauVar6 = (undefined1 (*) [16])local_f68;
    auVar21 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar22 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    aVar1 = (ray->super_RayK<1>).dir.field_0;
    auVar24._8_4_ = 0x7fffffff;
    auVar24._0_8_ = 0x7fffffff7fffffff;
    auVar24._12_4_ = 0x7fffffff;
    auVar24 = vandps_avx((undefined1  [16])aVar1,auVar24);
    auVar26._8_4_ = 0x219392ef;
    auVar26._0_8_ = 0x219392ef219392ef;
    auVar26._12_4_ = 0x219392ef;
    auVar24 = vcmpps_avx(auVar24,auVar26,1);
    auVar24 = vblendvps_avx((undefined1  [16])aVar1,auVar26,auVar24);
    auVar26 = vrcpps_avx(auVar24);
    auVar27._8_4_ = 0x3f800000;
    auVar27._0_8_ = 0x3f8000003f800000;
    auVar27._12_4_ = 0x3f800000;
    auVar24 = vfnmadd231ps_fma(auVar27,auVar26,auVar24);
    auVar27 = vfmadd132ps_fma(auVar24,auVar26,auVar26);
    fVar25 = auVar27._0_4_;
    uStack_f70 = 0;
    local_f88._4_4_ = fVar25;
    local_f88._0_4_ = fVar25;
    local_f88._8_4_ = fVar25;
    local_f88._12_4_ = fVar25;
    auVar32 = ZEXT1664(local_f88);
    auVar24 = vmovshdup_avx(auVar27);
    local_f98 = vshufps_avx(auVar27,auVar27,0x55);
    auVar33 = ZEXT1664(local_f98);
    auVar26 = vshufpd_avx(auVar27,auVar27,1);
    auVar30._0_4_ = fVar25 * (ray->super_RayK<1>).org.field_0.m128[0];
    auVar30._4_4_ = auVar27._4_4_ * (ray->super_RayK<1>).org.field_0.m128[1];
    auVar30._8_4_ = auVar27._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2];
    auVar30._12_4_ = auVar27._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3];
    local_fa8 = vshufps_avx(auVar27,auVar27,0xaa);
    auVar34 = ZEXT1664(local_fa8);
    auVar27 = vshufps_avx(auVar30,auVar30,0x55);
    auVar23 = vshufps_avx(auVar30,auVar30,0xaa);
    uVar17 = (ulong)(fVar25 < 0.0) << 4;
    uVar16 = (ulong)(auVar24._0_4_ < 0.0) << 4 | 0x20;
    uVar8 = (ulong)(auVar26._0_4_ < 0.0) << 4 | 0x40;
    uVar18 = uVar17 ^ 0x10;
    uVar9 = uVar16 ^ 0x10;
    uVar19 = auVar22._0_4_;
    auVar20 = ZEXT1664(CONCAT412(uVar19,CONCAT48(uVar19,CONCAT44(uVar19,uVar19))));
    uVar12 = CONCAT44(auVar30._0_4_,auVar30._0_4_);
    local_fb8._0_8_ = uVar12 ^ 0x8000000080000000;
    local_fb8._8_4_ = -auVar30._0_4_;
    local_fb8._12_4_ = -auVar30._0_4_;
    auVar29 = ZEXT1664(local_fb8);
    local_fc8._0_8_ = auVar27._0_8_ ^ 0x8000000080000000;
    local_fc8._8_4_ = auVar27._8_4_ ^ 0x80000000;
    local_fc8._12_4_ = auVar27._12_4_ ^ 0x80000000;
    auVar31 = ZEXT1664(local_fc8);
    local_fd8._0_8_ = auVar23._0_8_ ^ 0x8000000080000000;
    local_fd8._8_4_ = auVar23._8_4_ ^ 0x80000000;
    local_fd8._12_4_ = auVar23._12_4_ ^ 0x80000000;
    auVar35 = ZEXT1664(local_fd8);
    uVar19 = auVar21._0_4_;
    local_fe8._4_4_ = uVar19;
    local_fe8._0_4_ = uVar19;
    local_fe8._8_4_ = uVar19;
    local_fe8._12_4_ = uVar19;
    auVar36 = ZEXT1664(local_fe8);
    local_ff8 = context;
    local_1000 = ray;
    local_1008 = uVar17;
    local_1020 = uVar16;
LAB_0193453c:
    do {
      pauVar5 = pauVar6 + -1;
      pauVar6 = pauVar6 + -1;
      if (*(float *)(*pauVar5 + 8) <= (ray->super_RayK<1>).tfar) {
        uVar12 = *(ulong *)*pauVar6;
        while ((uVar12 & 8) == 0) {
          auVar24 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar12 + 0x20 + uVar17),auVar29._0_16_,
                                    auVar32._0_16_);
          auVar21 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar12 + 0x20 + uVar16),auVar31._0_16_,
                                    auVar33._0_16_);
          auVar24 = vpmaxsd_avx(auVar24,auVar21);
          auVar21 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar12 + 0x20 + uVar8),auVar35._0_16_,
                                    auVar34._0_16_);
          auVar21 = vpmaxsd_avx(auVar21,auVar36._0_16_);
          local_1018 = vpmaxsd_avx(auVar24,auVar21);
          auVar24 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar12 + 0x20 + uVar18),auVar29._0_16_,
                                    auVar32._0_16_);
          auVar21 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar12 + 0x20 + uVar9),auVar31._0_16_,
                                    auVar33._0_16_);
          auVar24 = vpminsd_avx(auVar24,auVar21);
          auVar21 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar12 + 0x20 + (uVar8 ^ 0x10)),
                                    auVar35._0_16_,auVar34._0_16_);
          auVar21 = vpminsd_avx(auVar21,auVar20._0_16_);
          auVar24 = vpminsd_avx(auVar24,auVar21);
          auVar24 = vpcmpgtd_avx(local_1018,auVar24);
          iVar11 = vmovmskps_avx(auVar24);
          if (iVar11 == 0xf) {
            if (pauVar6 == (undefined1 (*) [16])&local_f78) {
              return;
            }
            goto LAB_0193453c;
          }
          bVar10 = (byte)iVar11 ^ 0xf;
          uVar7 = uVar12 & 0xfffffffffffffff0;
          lVar4 = 0;
          for (uVar12 = (ulong)bVar10; (uVar12 & 1) == 0; uVar12 = uVar12 >> 1 | 0x8000000000000000)
          {
            lVar4 = lVar4 + 1;
          }
          uVar12 = *(ulong *)(uVar7 + lVar4 * 8);
          uVar14 = bVar10 - 1 & (uint)bVar10;
          uVar15 = (ulong)uVar14;
          if (uVar14 != 0) {
            uVar2 = *(uint *)(local_1018 + lVar4 * 4);
            lVar4 = 0;
            for (; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
              lVar4 = lVar4 + 1;
            }
            uVar14 = uVar14 - 1 & uVar14;
            uVar13 = (ulong)uVar14;
            uVar15 = *(ulong *)(uVar7 + lVar4 * 8);
            uVar3 = *(uint *)(local_1018 + lVar4 * 4);
            uVar16 = local_1020;
            if (uVar14 == 0) {
              if (uVar2 < uVar3) {
                *(ulong *)*pauVar6 = uVar15;
                *(uint *)(*pauVar6 + 8) = uVar3;
                pauVar6 = pauVar6 + 1;
              }
              else {
                *(ulong *)*pauVar6 = uVar12;
                *(uint *)(*pauVar6 + 8) = uVar2;
                pauVar6 = pauVar6 + 1;
                uVar12 = uVar15;
              }
            }
            else {
              auVar21._8_8_ = 0;
              auVar21._0_8_ = uVar12;
              auVar24 = vpunpcklqdq_avx(auVar21,ZEXT416(uVar2));
              auVar22._8_8_ = 0;
              auVar22._0_8_ = uVar15;
              auVar21 = vpunpcklqdq_avx(auVar22,ZEXT416(uVar3));
              lVar4 = 0;
              for (; (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x8000000000000000) {
                lVar4 = lVar4 + 1;
              }
              uVar14 = uVar14 - 1 & uVar14;
              uVar12 = (ulong)uVar14;
              auVar23._8_8_ = 0;
              auVar23._0_8_ = *(ulong *)(uVar7 + lVar4 * 8);
              auVar26 = vpunpcklqdq_avx(auVar23,ZEXT416(*(uint *)(local_1018 + lVar4 * 4)));
              auVar22 = vpcmpgtd_avx(auVar21,auVar24);
              if (uVar14 == 0) {
                auVar27 = vpshufd_avx(auVar22,0xaa);
                auVar22 = vblendvps_avx(auVar21,auVar24,auVar27);
                auVar24 = vblendvps_avx(auVar24,auVar21,auVar27);
                auVar21 = vpcmpgtd_avx(auVar26,auVar22);
                auVar27 = vpshufd_avx(auVar21,0xaa);
                auVar21 = vblendvps_avx(auVar26,auVar22,auVar27);
                auVar22 = vblendvps_avx(auVar22,auVar26,auVar27);
                auVar26 = vpcmpgtd_avx(auVar22,auVar24);
                auVar27 = vpshufd_avx(auVar26,0xaa);
                auVar26 = vblendvps_avx(auVar22,auVar24,auVar27);
                auVar24 = vblendvps_avx(auVar24,auVar22,auVar27);
                *pauVar6 = auVar24;
                pauVar6[1] = auVar26;
                uVar12 = auVar21._0_8_;
                pauVar6 = pauVar6 + 2;
              }
              else {
                lVar4 = 0;
                for (; (uVar12 & 1) == 0; uVar12 = uVar12 >> 1 | 0x8000000000000000) {
                  lVar4 = lVar4 + 1;
                }
                auVar28._8_8_ = 0;
                auVar28._0_8_ = *(ulong *)(uVar7 + lVar4 * 8);
                auVar23 = vpunpcklqdq_avx(auVar28,ZEXT416(*(uint *)(local_1018 + lVar4 * 4)));
                auVar27 = vpshufd_avx(auVar22,0xaa);
                auVar22 = vblendvps_avx(auVar21,auVar24,auVar27);
                auVar24 = vblendvps_avx(auVar24,auVar21,auVar27);
                auVar21 = vpcmpgtd_avx(auVar23,auVar26);
                auVar27 = vpshufd_avx(auVar21,0xaa);
                auVar21 = vblendvps_avx(auVar23,auVar26,auVar27);
                auVar26 = vblendvps_avx(auVar26,auVar23,auVar27);
                auVar27 = vpcmpgtd_avx(auVar26,auVar24);
                auVar23 = vpshufd_avx(auVar27,0xaa);
                auVar27 = vblendvps_avx(auVar26,auVar24,auVar23);
                auVar24 = vblendvps_avx(auVar24,auVar26,auVar23);
                auVar26 = vpcmpgtd_avx(auVar21,auVar22);
                auVar23 = vpshufd_avx(auVar26,0xaa);
                auVar26 = vblendvps_avx(auVar21,auVar22,auVar23);
                auVar21 = vblendvps_avx(auVar22,auVar21,auVar23);
                auVar22 = vpcmpgtd_avx(auVar27,auVar21);
                auVar23 = vpshufd_avx(auVar22,0xaa);
                auVar22 = vblendvps_avx(auVar27,auVar21,auVar23);
                auVar21 = vblendvps_avx(auVar21,auVar27,auVar23);
                *pauVar6 = auVar24;
                pauVar6[1] = auVar21;
                pauVar6[2] = auVar22;
                uVar12 = auVar26._0_8_;
                pauVar6 = pauVar6 + 3;
              }
            }
          }
        }
        local_ff0 = (ulong)((uint)uVar12 & 0xf) - 8;
        if (local_ff0 != 0) {
          prim = (Primitive *)(uVar12 & 0xfffffffffffffff0);
          do {
            InstanceArrayIntersector1::intersect(&local_1021,ray,context,prim);
            prim = prim + 1;
            local_ff0 = local_ff0 + -1;
            context = local_ff8;
            ray = local_1000;
          } while (local_ff0 != 0);
        }
        fVar25 = (ray->super_RayK<1>).tfar;
        auVar20 = ZEXT1664(CONCAT412(fVar25,CONCAT48(fVar25,CONCAT44(fVar25,fVar25))));
        auVar32 = ZEXT1664(local_f88);
        auVar33 = ZEXT1664(local_f98);
        auVar34 = ZEXT1664(local_fa8);
        auVar29 = ZEXT1664(local_fb8);
        auVar31 = ZEXT1664(local_fc8);
        auVar35 = ZEXT1664(local_fd8);
        auVar36 = ZEXT1664(local_fe8);
        uVar16 = local_1020;
        uVar17 = local_1008;
      }
    } while (pauVar6 != (undefined1 (*) [16])&local_f78);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }